

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O0

SharedPtr<Filter> __thiscall
Rml::FilterBasicInstancer::InstanceFilter
          (FilterBasicInstancer *this,String *name,PropertyDictionary *properties)

{
  bool bVar1;
  Property *this_00;
  element_type *this_01;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SharedPtr<Filter> SVar3;
  undefined1 local_48 [8];
  SharedPtr<Rml::FilterBasic> filter;
  float value;
  Property *p_value;
  PropertyDictionary *properties_local;
  String *name_local;
  FilterBasicInstancer *this_local;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,name[3].field_2._M_local_buf[8]);
  if (this_00 == (Property *)0x0) {
    ::std::shared_ptr<Rml::Filter>::shared_ptr((shared_ptr<Rml::Filter> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    filter.super___shared_ptr<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = Property::Get<float>(this_00);
    if (this_00->unit == PERCENT) {
      filter.super___shared_ptr<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = filter.super___shared_ptr<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ * 0.01;
    }
    else if (this_00->unit == DEG) {
      filter.super___shared_ptr<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = Math::DegreesToRadians
                        (filter.super___shared_ptr<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_);
    }
    MakeShared<Rml::FilterBasic>();
    this_01 = ::std::__shared_ptr_access<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
    bVar1 = FilterBasic::Initialise
                      (this_01,(String *)properties,
                       filter.super___shared_ptr<Rml::FilterBasic,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_);
    if (bVar1) {
      ::std::shared_ptr<Rml::Filter>::shared_ptr<Rml::FilterBasic,void>
                ((shared_ptr<Rml::Filter> *)this,(shared_ptr<Rml::FilterBasic> *)local_48);
    }
    else {
      ::std::shared_ptr<Rml::Filter>::shared_ptr((shared_ptr<Rml::Filter> *)this,(nullptr_t)0x0);
    }
    ::std::shared_ptr<Rml::FilterBasic>::~shared_ptr((shared_ptr<Rml::FilterBasic> *)local_48);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBasicInstancer::InstanceFilter(const String& name, const PropertyDictionary& properties)
{
	const Property* p_value = properties.GetProperty(ids.value);
	if (!p_value)
		return nullptr;

	float value = p_value->Get<float>();
	if (p_value->unit == Unit::PERCENT)
		value *= 0.01f;
	else if (p_value->unit == Unit::DEG)
		value = Rml::Math::DegreesToRadians(value);

	auto filter = MakeShared<FilterBasic>();
	if (filter->Initialise(name, value))
		return filter;

	return nullptr;
}